

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_swap(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pass;
  REF_GRID ref_grid_local;
  
  ref_grid_local._4_4_ = ref_cavity_pass(ref_grid);
  if (ref_grid_local._4_4_ == 0) {
    if ((ref_grid->surf != 0) || (ref_grid->twod != 0)) {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        uVar1 = ref_swap_tri_pass(ref_grid);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x261,"ref_adapt_swap",(ulong)uVar1,"swap pass");
          return uVar1;
        }
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x25e,
           "ref_adapt_swap",(ulong)ref_grid_local._4_4_,"cavity pass");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_swap(REF_GRID ref_grid) {
  REF_INT pass;
  RSS(ref_cavity_pass(ref_grid), "cavity pass");
  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    for (pass = 0; pass < 3; pass++) {
      RSS(ref_swap_tri_pass(ref_grid), "swap pass");
    }
  }
  return REF_SUCCESS;
}